

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int lws_system_do_attach(lws_context_per_thread *pt)

{
  uint32_t uVar1;
  _func_int_lws_context_ptr_int_lws_attach_cb_t_lws_system_states_t_void_ptr_lws_attach_item_ptr_ptr
  *p_Var2;
  int iVar3;
  lws_attach_item *in_RAX;
  lws_attach_item *item;
  lws_attach_item *local_28;
  
  uVar1 = (pt->attach_owner).count;
  local_28 = in_RAX;
  while( true ) {
    if (uVar1 == 0) {
      return 0;
    }
    p_Var2 = pt->context->system_ops->attach;
    if (p_Var2 == (_func_int_lws_context_ptr_int_lws_attach_cb_t_lws_system_states_t_void_ptr_lws_attach_item_ptr_ptr
                   *)0x0) {
      __assert_fail("pt->context->system_ops->attach",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/system/system.c"
                    ,0xe3,"int lws_system_do_attach(struct lws_context_per_thread *)");
    }
    iVar3 = (*p_Var2)(pt->context,(int)pt->tid,(lws_attach_cb_t)0x0,LWS_SYSTATE_UNKNOWN,(void *)0x0,
                      &local_28);
    if (iVar3 != 0) {
      _lws_log(1,"%s: attach problem\n","lws_system_do_attach");
      return 1;
    }
    if (local_28 == (lws_attach_item *)0x0) break;
    (*local_28->cb)(pt->context,(int)pt->tid,local_28->opaque);
    lws_realloc(local_28,0,"lws_free");
    uVar1 = (pt->attach_owner).count;
  }
  return 0;
}

Assistant:

int
lws_system_do_attach(struct lws_context_per_thread *pt)
{
	/*
	 * If nothing to do, we just return immediately
	 */

	while (pt->attach_owner.count) {

		struct lws_attach_item *item;

		/*
		 * If anybody used the attach apis, there must be an
		 * implementation of the (*attach) lws_system op function
		 */

		assert(pt->context->system_ops->attach);
		if (!pt->context->system_ops->attach) {
			lwsl_err("%s: define (*attach)\n", __func__);
			return 1;
		}

		/*
		 * System locking is applied only around this next call, while
		 * we detach and get a pointer to the tail attach item.  We
		 * become responsible to free what we have detached.
		 */

		if (pt->context->system_ops->attach(pt->context, pt->tid, NULL,
						    0, NULL, &item)) {
			lwsl_err("%s: attach problem\n", __func__);
			return 1;
		}

		if (!item)
			/* there's nothing more to do at the moment */
			return 0;

		/*
		 * Do the callback from the lws event loop thread
		 */

		item->cb(pt->context, pt->tid, item->opaque);

		/* it's done, destroy the item */

		lws_free(item);
	}

	return 0;
}